

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetField
               (uint32_t field_number,FieldDescriptor *field,Message *message,
               CodedInputStream *input)

{
  byte bVar1;
  uint8_t *puVar2;
  MessageLite *this;
  UnknownFieldSet *unknown_fields;
  pair<int,_int> pVar3;
  Nonnull<const_char_*> pcVar4;
  undefined8 extraout_RAX;
  bool bVar5;
  int byte_limit;
  string_view str;
  Metadata MVar6;
  LogMessage LStack_38;
  
  MVar6 = Message::GetMetadata(message);
  if (field == (FieldDescriptor *)0x0) {
    unknown_fields = Reflection::MutableUnknownFields(MVar6.reflection,message);
    bVar5 = SkipMessageSetField(input,field_number,unknown_fields);
    return bVar5;
  }
  bVar1 = field->field_0x1;
  bVar5 = (bool)((bVar1 & 0x20) >> 5);
  if (0xbf < bVar1 == bVar5) {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                       (bVar5,0xbf < bVar1,
                        "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    if (((field->field_0x1 & 0x20) == 0) && (field->type_ == '\v')) {
      this = &Reflection::MutableMessage(MVar6.reflection,message,field,input->extension_factory_)->
              super_MessageLite;
      puVar2 = input->buffer_;
      if ((puVar2 < input->buffer_end_) && (byte_limit = (int)(char)*puVar2, -1 < (char)*puVar2)) {
        input->buffer_ = puVar2 + 1;
        bVar5 = true;
      }
      else {
        byte_limit = io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar5 = -1 < byte_limit;
      }
      if (bVar5) {
        pVar3 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,byte_limit);
        if (-1 < (long)pVar3) {
          bVar5 = MessageLite::MergePartialFromCodedStream(this,input);
          if (bVar5) {
            bVar5 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,pVar3.first);
            return bVar5;
          }
        }
      }
    }
    else {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                (&LStack_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
                 ,0x169);
      str._M_str = "Extensions of MessageSets must be optional messages.";
      str._M_len = 0x34;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&LStack_38,str);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage(&LStack_38);
    }
    return false;
  }
  ParseAndMergeMessageSetField();
  absl::lts_20250127::log_internal::LogMessage::~LogMessage(&LStack_38);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetField(uint32_t field_number,
                                              const FieldDescriptor* field,
                                              Message* message,
                                              io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();
  if (field == nullptr) {
    // We store unknown MessageSet extensions as groups.
    return SkipMessageSetField(
        input, field_number, message_reflection->MutableUnknownFields(message));
  } else if (field->is_repeated() ||
             field->type() != FieldDescriptor::TYPE_MESSAGE) {
    // This shouldn't happen as we only allow optional message extensions to
    // MessageSet.
    ABSL_LOG(ERROR) << "Extensions of MessageSets must be optional messages.";
    return false;
  } else {
    Message* sub_message = message_reflection->MutableMessage(
        message, field, input->GetExtensionFactory());
    return WireFormatLite::ReadMessage(input, sub_message);
  }
}